

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaForce.c
# Opt level: O2

int Frc_ManCrossCut2_rec(Frc_Man_t *p,Frc_Obj_t *pObj)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar1 = pObj->iFanout;
  if (uVar1 != 0) {
    uVar3 = uVar1 - 1;
    pObj->iFanout = uVar3;
    if (uVar1 == pObj->nFanouts) {
      iVar2 = p->nCutCur + 1;
      p->nCutCur = iVar2;
      if (iVar2 < p->nCutMax) {
        iVar2 = p->nCutMax;
      }
      p->nCutMax = iVar2;
      if ((*(uint *)pObj & 1) == 0) {
        for (uVar4 = (ulong)(*(uint *)pObj >> 4); 0 < (long)uVar4; uVar4 = uVar4 - 1) {
          iVar2 = Frc_ManCrossCut2_rec
                            (p,(Frc_Obj_t *)
                               ((long)pObj + (long)(int)(&pObj->field_9)[uVar4].iFanin * -4));
          p->nCutCur = p->nCutCur - iVar2;
        }
        uVar3 = pObj->iFanout;
      }
    }
    return (uint)(uVar3 == 0);
  }
  __assert_fail("pObj->iFanout > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaForce.c"
                ,0x279,"int Frc_ManCrossCut2_rec(Frc_Man_t *, Frc_Obj_t *)");
}

Assistant:

int Frc_ManCrossCut2_rec( Frc_Man_t * p, Frc_Obj_t * pObj )
{
    assert( pObj->iFanout > 0 );
    if ( pObj->iFanout-- == pObj->nFanouts )
    {
        Frc_Obj_t * pFanin;
        int i;
        p->nCutCur++;
        p->nCutMax = Abc_MaxInt( p->nCutMax, p->nCutCur );
        if ( !Frc_ObjIsCi(pObj) )
            Frc_ObjForEachFaninReverse( pObj, pFanin, i )
                p->nCutCur -= Frc_ManCrossCut2_rec( p, pFanin );
    }
    return pObj->iFanout == 0;
}